

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O0

int Signal::produceAudio(double *in,int inLength,short **out,int *outLength,double volume)

{
  short sVar1;
  short *psVar2;
  int local_3c;
  int i;
  double volume_local;
  int *outLength_local;
  short **out_local;
  int inLength_local;
  double *in_local;
  
  if (in == (double *)0x0) {
    printf("Input buffer is NULL! Aborting audio samples production...\n");
    in_local._4_4_ = -1;
  }
  else {
    *outLength = inLength;
    if (*out == (short *)0x0) {
      psVar2 = (short *)malloc((long)(*outLength << 1) << 1);
      *out = psVar2;
    }
    for (local_3c = 0; local_3c < *outLength; local_3c = local_3c + 1) {
      sVar1 = (short)(int)(in[local_3c] * volume * 32767.0);
      (*out)[local_3c * 2 + 1] = sVar1;
      (*out)[local_3c << 1] = sVar1;
    }
    in_local._4_4_ = 0;
  }
  return in_local._4_4_;
}

Assistant:

int Signal::produceAudio(double * in, int inLength, short ** out, int * outLength, double volume)
{
    int i;

    // Return error if input signal is empty
    if (in == NULL)
    {
    	printf("Input buffer is NULL! Aborting audio samples production...\n");
    	return -1;
    }

    // Output length is the same as input length
    *outLength = inLength;

    // If the output signal is not allocated, allocate it
    if (*out == NULL)
    {
    	*out = (short *) malloc(2 * (*outLength) * sizeof(short));
    }

    // Produce the final audio signal
    for (i = 0; i < *outLength; i++)
    {
        (*out)[2 * i] = (*out)[2 * i + 1] = (short) (in[i] * volume * 32767);
    }

    return 0;
}